

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O2

int quicly_decode_ack_frame(uint8_t **src,uint8_t *end,quicly_ack_frame_t *frame,int is_ack_ecn)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = quicly_decodev(src,end);
  frame->largest_acknowledged = uVar1;
  iVar3 = 7;
  if (uVar1 != 0xffffffffffffffff) {
    uVar1 = quicly_decodev(src,end);
    frame->ack_delay = uVar1;
    if (uVar1 != 0xffffffffffffffff) {
      uVar1 = quicly_decodev(src,end);
      frame->num_gaps = uVar1;
      if (((uVar1 != 0xffffffffffffffff) &&
          (uVar1 = quicly_decodev(src,end), uVar1 != 0xffffffffffffffff)) &&
         (uVar1 <= frame->largest_acknowledged)) {
        frame->smallest_acknowledged = frame->largest_acknowledged - uVar1;
        frame->ack_block_lengths[0] = uVar1 + 1;
        for (uVar1 = 0; uVar1 != frame->num_gaps; uVar1 = uVar1 + 1) {
          uVar2 = quicly_decodev(src,end);
          if (uVar2 == 0xffffffffffffffff) {
            return 7;
          }
          frame->gaps[uVar1] = uVar2 + 1;
          if (frame->smallest_acknowledged <= uVar2) {
            return 7;
          }
          frame->smallest_acknowledged = frame->smallest_acknowledged - (uVar2 + 1);
          uVar2 = quicly_decodev(src,end);
          if (uVar2 == 0xffffffffffffffff) {
            return 7;
          }
          if (frame->smallest_acknowledged <= uVar2) {
            return 7;
          }
          frame->ack_block_lengths[uVar1 + 1] = uVar2 + 1;
          frame->smallest_acknowledged = frame->smallest_acknowledged - (uVar2 + 1);
        }
        if (is_ack_ecn == 0) {
LAB_0011d0fe:
          iVar3 = 0;
        }
        else {
          lVar4 = 4;
          do {
            lVar4 = lVar4 + -1;
            if (lVar4 == 0) goto LAB_0011d0fe;
            uVar1 = quicly_decodev(src,end);
          } while (uVar1 != 0xffffffffffffffff);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int quicly_decode_ack_frame(const uint8_t **src, const uint8_t *end, quicly_ack_frame_t *frame, int is_ack_ecn)
{
    uint64_t i, tmp;

    if ((frame->largest_acknowledged = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->ack_delay = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->num_gaps = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;

    if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if (frame->largest_acknowledged < tmp)
        goto Error;
    frame->smallest_acknowledged = frame->largest_acknowledged - tmp;
    frame->ack_block_lengths[0] = tmp + 1;

    for (i = 0; i != frame->num_gaps; ++i) {
        if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        frame->gaps[i] = tmp + 1;
        if (frame->smallest_acknowledged < frame->gaps[i])
            goto Error;
        frame->smallest_acknowledged -= frame->gaps[i];
        if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        tmp += 1;
        if (frame->smallest_acknowledged < tmp)
            goto Error;
        frame->ack_block_lengths[i + 1] = tmp;
        frame->smallest_acknowledged -= tmp;
    }

    if (is_ack_ecn) {
        /* just skip ECT(0), ECT(1), ECT-CE counters for the time being */
        for (i = 0; i != 3; ++i)
            if (quicly_decodev(src, end) == UINT64_MAX)
                goto Error;
    }
    return 0;
Error:
    return QUICLY_ERROR_FRAME_ENCODING;
}